

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_align.c
# Opt level: O3

void print_rowcol(char *filename,int *row,int *col,char *s1,int s1Len,char *s2,int s2Len,
                 parasail_result_t *result)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    printf("fopen(\"%s\") error: %s\n",filename,pcVar3);
    exit(-1);
  }
  iVar1 = parasail_result_is_saturated(result);
  fprintf(__stream,"saturated=%d\n",(ulong)(iVar1 != 0));
  fputc((int)s1[(long)s1Len + -1],__stream);
  if (row == (int *)0x0) {
    iVar1 = s2Len;
    if (0 < s2Len) {
      do {
        fprintf(__stream,"%4c",0x21);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  else if (0 < s2Len) {
    uVar4 = 0;
    do {
      fprintf(__stream,"%4d",(ulong)(uint)row[uVar4]);
      uVar4 = uVar4 + 1;
    } while ((uint)s2Len != uVar4);
  }
  fputc(10,__stream);
  fputc((int)s2[(long)s2Len + -1],__stream);
  if (col == (int *)0x0) {
    if (0 < s1Len) {
      do {
        fprintf(__stream,"%4c",0x21);
        s1Len = s1Len + -1;
      } while (s1Len != 0);
    }
  }
  else if (0 < s1Len) {
    uVar4 = 0;
    do {
      fprintf(__stream,"%4d",(ulong)(uint)col[uVar4]);
      uVar4 = uVar4 + 1;
    } while ((uint)s1Len != uVar4);
  }
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

static void print_rowcol(
        const char * filename,
        const int * const restrict row,
        const int * const restrict col,
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        parasail_result_t *result)
{
    int i;
    int j;
    FILE *f = NULL;

    f = fopen(filename, "w");
    if (NULL == f) {
        printf("fopen(\"%s\") error: %s\n", filename, strerror(errno));
        exit(-1);
    }
    fprintf(f, "saturated=%d\n", parasail_result_is_saturated(result) ? 1 : 0);
    fprintf(f, "%c", s1[s1Len-1]);
    if (NULL == row) {
        for (j=0; j<s2Len; ++j) {
            fprintf(f, "%4c", '!');
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            fprintf(f, "%4d", row[j]);
        }
    }
    fprintf(f, "\n");
    fprintf(f, "%c", s2[s2Len-1]);
    if (NULL == col) {
        for (i=0; i<s1Len; ++i) {
            fprintf(f, "%4c", '!');
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            fprintf(f, "%4d", col[i]);
        }
    }
    fprintf(f, "\n");
    fclose(f);
}